

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O1

void checkARCAccessorsSlow(Class cls)

{
  byte *pbVar1;
  SEL expected;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  long lVar6;
  objc_method_list *poVar7;
  bool bVar8;
  bool bVar9;
  
  if ((dtable_t)cls->dtable == uninstalled_dtable) {
    if (checkARCAccessorsSlow::retain == (SEL)0x0) {
      checkARCAccessorsSlow::retain = sel_registerName("retain");
      checkARCAccessorsSlow::release = sel_registerName("release");
      checkARCAccessorsSlow::autorelease = sel_registerName("autorelease");
      checkARCAccessorsSlow::isARC = sel_registerName("_ARCCompliantRetainRelease");
    }
    if (cls->super_class == (Class)0x0) {
      bVar8 = false;
    }
    else {
      checkARCAccessorsSlow(cls->super_class);
      bVar8 = (cls->super_class->info & 0x800) == 0;
    }
    poVar7 = (objc_method_list *)&cls->methods;
    bVar3 = false;
    do {
      poVar7 = poVar7->next;
      if (poVar7 == (objc_method_list *)0x0) goto LAB_001104a8;
      bVar2 = 0 < poVar7->count;
      if (0 < poVar7->count) {
        lVar6 = 0;
        do {
          if (poVar7->size < 0x18) {
            __assert_fail("l->size >= sizeof(struct objc_method)",
                          "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/method.h"
                          ,0x53,
                          "struct objc_method *method_at_index(struct objc_method_list *, int)");
          }
          expected = *(SEL *)((long)&poVar7[1].count + poVar7->size * lVar6);
          BVar5 = selEqualUnTyped(expected,checkARCAccessorsSlow::retain);
          bVar9 = true;
          bVar4 = true;
          if (BVar5 == '\0') {
            BVar5 = selEqualUnTyped(expected,checkARCAccessorsSlow::release);
            bVar9 = true;
            bVar4 = true;
            if (BVar5 == '\0') {
              BVar5 = selEqualUnTyped(expected,checkARCAccessorsSlow::autorelease);
              bVar9 = true;
              if (BVar5 == '\0') {
                BVar5 = selEqualUnTyped(expected,checkARCAccessorsSlow::isARC);
                bVar9 = BVar5 == '\0';
                bVar4 = bVar3;
                if (!bVar9) {
                  pbVar1 = (byte *)((long)&cls->info + 1);
                  *pbVar1 = *pbVar1 | 8;
                }
              }
              else {
                bVar4 = true;
              }
            }
          }
          bVar3 = bVar4;
          if (!bVar9) break;
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < poVar7->count;
        } while (lVar6 < poVar7->count);
      }
    } while (!bVar2);
    bVar8 = true;
LAB_001104a8:
    if (!bVar3 && !bVar8) {
      pbVar1 = (byte *)((long)&cls->info + 1);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  return;
}

Assistant:

PRIVATE void checkARCAccessorsSlow(Class cls)
{
	if (cls->dtable != uninstalled_dtable)
	{
		return;
	}
	static SEL retain, release, autorelease, isARC;
	if (NULL == retain)
	{
		retain = sel_registerName("retain");
		release = sel_registerName("release");
		autorelease = sel_registerName("autorelease");
		isARC = sel_registerName("_ARCCompliantRetainRelease");
	}
	BOOL superIsFast = YES;
	if (cls->super_class != Nil)
	{
		checkARCAccessorsSlow(cls->super_class);
		superIsFast = objc_test_class_flag(cls->super_class, objc_class_flag_fast_arc);
	}
	BOOL selfImplementsRetainRelease = NO;
	for (struct objc_method_list *l=cls->methods ; l != NULL ; l= l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			SEL s = method_at_index(l, i)->selector;
			if (selEqualUnTyped(s, retain) ||
			    selEqualUnTyped(s, release) ||
			    selEqualUnTyped(s, autorelease))
			{
				selfImplementsRetainRelease = YES;
			}
			else if (selEqualUnTyped(s, isARC))
			{
				objc_set_class_flag(cls, objc_class_flag_fast_arc);
				return;
			}
		}
	}
	if (superIsFast && !selfImplementsRetainRelease)
	{
		objc_set_class_flag(cls, objc_class_flag_fast_arc);
	}
}